

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

int dictionary_set(dictionary *d,char *key,char *val)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *local_48;
  char *local_40;
  long lStack_30;
  uint hash;
  ssize_t i;
  char *val_local;
  char *key_local;
  dictionary *d_local;
  
  if ((d == (dictionary *)0x0) || (key == (char *)0x0)) {
    d_local._4_4_ = -1;
  }
  else {
    uVar1 = dictionary_hash(key);
    if (0 < d->n) {
      for (lStack_30 = 0; lStack_30 < d->size; lStack_30 = lStack_30 + 1) {
        if (((d->key[lStack_30] != (char *)0x0) && (uVar1 == d->hash[lStack_30])) &&
           (iVar2 = strcmp(key,d->key[lStack_30]), iVar2 == 0)) {
          if (d->val[lStack_30] != (char *)0x0) {
            free(d->val[lStack_30]);
          }
          if (val == (char *)0x0) {
            local_40 = (char *)0x0;
          }
          else {
            local_40 = xstrdup(val);
          }
          d->val[lStack_30] = local_40;
          return 0;
        }
      }
    }
    if (((long)d->n == d->size) && (iVar2 = dictionary_grow(d), iVar2 != 0)) {
      d_local._4_4_ = -1;
    }
    else {
      lStack_30 = (long)d->n;
      while (d->key[lStack_30] != (char *)0x0) {
        lStack_30 = lStack_30 + 1;
        if (lStack_30 == d->size) {
          lStack_30 = 0;
        }
      }
      pcVar3 = xstrdup(key);
      d->key[lStack_30] = pcVar3;
      if (val == (char *)0x0) {
        local_48 = (char *)0x0;
      }
      else {
        local_48 = xstrdup(val);
      }
      d->val[lStack_30] = local_48;
      d->hash[lStack_30] = uVar1;
      d->n = d->n + 1;
      d_local._4_4_ = 0;
    }
  }
  return d_local._4_4_;
}

Assistant:

int dictionary_set(dictionary * d, const char * key, const char * val)
{
    ssize_t         i ;
    unsigned       hash ;

    if (d == NULL || key == NULL) return -1 ;

    /* Compute hash for this key */
    hash = dictionary_hash(key) ;
    /* Find if value is already in dictionary */
    if (d->n > 0) {
        for (i = 0 ; i < d->size ; i++) {
            if (d->key[i] == NULL)
                continue ;
            if (hash == d->hash[i]) { /* Same hash value */
                if (!strcmp(key, d->key[i])) {   /* Same key */
                    /* Found a value: modify and return */
                    if (d->val[i] != NULL)
                        free(d->val[i]);
                    d->val[i] = (val ? xstrdup(val) : NULL);
                    /* Value has been modified: return */
                    return 0 ;
                }
            }
        }
    }
    /* Add a new value */
    /* See if dictionary needs to grow */
    if (d->n == d->size) {
        /* Reached maximum size: reallocate dictionary */
        if (dictionary_grow(d) != 0)
            return -1;
    }

    /* Insert key in the first empty slot. Start at d->n and wrap at
       d->size. Because d->n < d->size this will necessarily
       terminate. */
    for (i = d->n ; d->key[i] ; ) {
        if (++i == d->size) i = 0;
    }
    /* Copy key */
    d->key[i]  = xstrdup(key);
    d->val[i]  = (val ? xstrdup(val) : NULL) ;
    d->hash[i] = hash;
    d->n ++ ;
    return 0 ;
}